

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O0

void RC2_cbc_encrypt(uchar *in,uchar *out,long length,RC2_KEY *ks,uchar *iv,int enc)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  undefined1 *puVar6;
  uint local_60;
  uint local_5c;
  uint32_t tin [2];
  long l;
  uint local_48;
  uint32_t xor1;
  uint32_t xor0;
  uint32_t tout1;
  uint32_t tout0;
  uint32_t tin1;
  uint32_t tin0;
  int encrypt_local;
  uint8_t *iv_local;
  RC2_KEY *ks_local;
  size_t length_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  length_local = (size_t)out;
  out_local = in;
  if (enc == 0) {
    l._4_4_ = *(uint *)(iv + 4);
    local_48 = *(uint *)iv;
    for (tin = (uint32_t  [2])(length + -8); -1 < (long)tin; tin = (uint32_t  [2])((long)tin + -8))
    {
      puVar5 = (uint *)(out_local + 4);
      uVar3 = *(uint *)out_local;
      out_local = out_local + 8;
      uVar4 = *puVar5;
      local_60 = uVar3;
      local_5c = uVar4;
      RC2_decrypt((ulong *)&local_60,ks);
      local_60 = local_60 ^ local_48;
      local_5c = local_5c ^ l._4_4_;
      *(char *)length_local = (char)local_60;
      *(char *)(length_local + 1) = (char)(local_60 >> 8);
      *(char *)(length_local + 2) = (char)(local_60 >> 0x10);
      *(char *)(length_local + 3) = (char)(local_60 >> 0x18);
      *(char *)(length_local + 4) = (char)local_5c;
      *(char *)(length_local + 5) = (char)(local_5c >> 8);
      puVar6 = (undefined1 *)(length_local + 7);
      *(char *)(length_local + 6) = (char)(local_5c >> 0x10);
      length_local = length_local + 8;
      *puVar6 = (char)(local_5c >> 0x18);
      l._4_4_ = uVar4;
      local_48 = uVar3;
    }
    if (tin != (uint32_t  [2])0xfffffffffffffff8) {
      uVar3 = *(uint *)out_local;
      uVar4 = *(uint *)(out_local + 4);
      local_60 = uVar3;
      local_5c = uVar4;
      RC2_decrypt((ulong *)&local_60,ks);
      local_60 = local_60 ^ local_48;
      local_5c = local_5c ^ l._4_4_;
      sVar2 = (long)tin + 8 + length_local;
      l._4_4_ = uVar4;
      local_48 = uVar3;
      length_local = sVar2;
      switch(tin) {
      case (uint32_t  [2])0x0:
        length_local = sVar2 - 1;
        *(char *)(sVar2 - 1) = (char)(local_5c >> 0x18);
      case (uint32_t  [2])0xffffffffffffffff:
        *(char *)(length_local - 1) = (char)(local_5c >> 0x10);
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffffe:
        *(char *)(length_local - 1) = (char)(local_5c >> 8);
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffffd:
        *(char *)(length_local - 1) = (char)local_5c;
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffffc:
        *(char *)(length_local - 1) = (char)(local_60 >> 0x18);
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffffb:
        *(char *)(length_local - 1) = (char)(local_60 >> 0x10);
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffffa:
        *(char *)(length_local - 1) = (char)(local_60 >> 8);
        length_local = length_local - 1;
      case (uint32_t  [2])0xfffffffffffffff9:
        *(char *)(length_local - 1) = (char)local_60;
      }
    }
    *iv = (uchar)local_48;
    iv[1] = (uchar)(local_48 >> 8);
    iv[2] = (uchar)(local_48 >> 0x10);
    iv[3] = (uchar)(local_48 >> 0x18);
    iv[4] = (uchar)l._4_4_;
    iv[5] = (uchar)(l._4_4_ >> 8);
    iv[6] = (uchar)(l._4_4_ >> 0x10);
    iv[7] = (uchar)(l._4_4_ >> 0x18);
  }
  else {
    xor0 = *(uint32_t *)iv;
    xor1 = *(uint32_t *)(iv + 4);
    for (tin = (uint32_t  [2])(length + -8); -1 < (long)tin; tin = (uint32_t  [2])((long)tin + -8))
    {
      puVar5 = (uint *)(out_local + 4);
      local_60 = *(uint *)out_local;
      out_local = out_local + 8;
      local_60 = xor0 ^ local_60;
      local_5c = xor1 ^ *puVar5;
      RC2_encrypt((ulong *)&local_60,ks);
      xor0 = local_60;
      *(char *)length_local = (char)local_60;
      *(char *)(length_local + 1) = (char)(local_60 >> 8);
      *(char *)(length_local + 2) = (char)(local_60 >> 0x10);
      *(char *)(length_local + 3) = (char)(local_60 >> 0x18);
      xor1 = local_5c;
      *(char *)(length_local + 4) = (char)local_5c;
      *(char *)(length_local + 5) = (char)(local_5c >> 8);
      puVar6 = (undefined1 *)(length_local + 7);
      *(char *)(length_local + 6) = (char)(local_5c >> 0x10);
      length_local = length_local + 8;
      *puVar6 = (char)(local_5c >> 0x18);
    }
    if (tin != (uint32_t  [2])0xfffffffffffffff8) {
      puVar1 = out_local + (long)tin + 8;
      tout1 = 0;
      tout0 = 0;
      out_local = puVar1;
      switch(tin) {
      case (uint32_t  [2])0x0:
        out_local = puVar1 + -1;
        tout1 = (uint)puVar1[-1] << 0x18;
      case (uint32_t  [2])0xffffffffffffffff:
        tout1 = (uint)out_local[-1] << 0x10 | tout1;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffffe:
        tout1 = (uint)out_local[-1] << 8 | tout1;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffffd:
        tout1 = out_local[-1] | tout1;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffffc:
        tout0 = (uint)out_local[-1] << 0x18;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffffb:
        tout0 = (uint)out_local[-1] << 0x10 | tout0;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffffa:
        tout0 = (uint)out_local[-1] << 8 | tout0;
        out_local = out_local + -1;
      case (uint32_t  [2])0xfffffffffffffff9:
        tout0 = out_local[-1] | tout0;
      default:
        local_60 = xor0 ^ tout0;
        local_5c = xor1 ^ tout1;
        RC2_encrypt((ulong *)&local_60,ks);
        xor0 = local_60;
        *(char *)length_local = (char)local_60;
        *(char *)(length_local + 1) = (char)(local_60 >> 8);
        *(char *)(length_local + 2) = (char)(local_60 >> 0x10);
        *(char *)(length_local + 3) = (char)(local_60 >> 0x18);
        xor1 = local_5c;
        *(char *)(length_local + 4) = (char)local_5c;
        *(char *)(length_local + 5) = (char)(local_5c >> 8);
        *(char *)(length_local + 6) = (char)(local_5c >> 0x10);
        *(char *)(length_local + 7) = (char)(local_5c >> 0x18);
      }
    }
    *iv = (uchar)xor0;
    iv[1] = (uchar)(xor0 >> 8);
    iv[2] = (uchar)(xor0 >> 0x10);
    iv[3] = (uchar)(xor0 >> 0x18);
    iv[4] = (uchar)xor1;
    iv[5] = (uchar)(xor1 >> 8);
    iv[6] = (uchar)(xor1 >> 0x10);
    iv[7] = (uchar)(xor1 >> 0x18);
  }
  return;
}

Assistant:

static void RC2_cbc_encrypt(const uint8_t *in, uint8_t *out, size_t length,
                            RC2_KEY *ks, uint8_t *iv, int encrypt) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  long l = length;
  uint32_t tin[2];

  if (encrypt) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (l != -8) {
      c2ln(in, tin0, tin1, l + 8);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (l != -8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, l + 8);
      xor0 = tin0;
      xor1 = tin1;
    }
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}